

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

bool fmt::v9::detail::is_printable
               (uint16_t x,singleton *singletons,size_t singletons_size,uchar *singleton_lowers,
               uchar *normal,size_t normal_size)

{
  uchar *puVar1;
  byte bVar2;
  long lVar3;
  bool bVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  undefined6 in_register_0000003a;
  ulong uVar8;
  size_t i;
  size_t sVar9;
  uint uVar10;
  
  uVar8 = CONCAT62(in_register_0000003a,x);
  uVar5 = (uint)(uVar8 >> 8) & 0xffffff;
  uVar7 = 0;
  for (sVar9 = 0; sVar9 != singletons_size; sVar9 = sVar9 + 1) {
    uVar10 = singletons[sVar9].lower_count + uVar7;
    if (uVar5 < singletons[sVar9].upper) break;
    if (uVar5 == singletons[sVar9].upper) {
      uVar6 = (ulong)uVar7;
      while (uVar6 < uVar10) {
        puVar1 = singleton_lowers + uVar6;
        uVar6 = uVar6 + 1;
        if (*puVar1 == (uchar)x) {
          return false;
        }
      }
    }
    uVar7 = uVar10;
  }
  bVar4 = true;
  uVar6 = 0;
  while( true ) {
    if (normal_size <= uVar6) {
      return bVar4;
    }
    bVar2 = normal[uVar6];
    uVar7 = (uint)bVar2;
    if ((char)bVar2 < '\0') {
      lVar3 = uVar6 + 1;
      uVar6 = uVar6 + 1;
      uVar7 = (bVar2 & 0x7f) << 8 | (uint)normal[lVar3];
    }
    uVar7 = (int)uVar8 - uVar7;
    uVar8 = (ulong)uVar7;
    if ((int)uVar7 < 0) break;
    bVar4 = (bool)(bVar4 ^ 1);
    uVar6 = uVar6 + 1;
  }
  return bVar4;
}

Assistant:

inline auto is_printable(uint16_t x, const singleton* singletons,
                         size_t singletons_size,
                         const unsigned char* singleton_lowers,
                         const unsigned char* normal, size_t normal_size)
    -> bool {
  auto upper = x >> 8;
  auto lower_start = 0;
  for (size_t i = 0; i < singletons_size; ++i) {
    auto s = singletons[i];
    auto lower_end = lower_start + s.lower_count;
    if (upper < s.upper) break;
    if (upper == s.upper) {
      for (auto j = lower_start; j < lower_end; ++j) {
        if (singleton_lowers[j] == (x & 0xff)) return false;
      }
    }
    lower_start = lower_end;
  }

  auto xsigned = static_cast<int>(x);
  auto current = true;
  for (size_t i = 0; i < normal_size; ++i) {
    auto v = static_cast<int>(normal[i]);
    auto len = (v & 0x80) != 0 ? (v & 0x7f) << 8 | normal[++i] : v;
    xsigned -= len;
    if (xsigned < 0) break;
    current = !current;
  }
  return current;
}